

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

void Jupiter::reinitialize_plugins(void)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  
  plVar3 = plugins;
  while( true ) {
    lVar1 = *plVar3;
    lVar2 = plVar3[1];
    if (lVar1 == lVar2) break;
    Jupiter::Plugin::free((lVar2 - lVar1 >> 3) - 1);
  }
  initialize_plugins();
  return;
}

Assistant:

void reinitialize_plugins() {
	// Uninitialize back -> front
	while (!Jupiter::plugins.empty()) {
		Jupiter::Plugin::free(Jupiter::plugins.size() - 1);
	}

	initialize_plugins();
}